

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.h
# Opt level: O3

void yyml::Factory<yyml::nn::Variable<double>_>::RemoveInstance(Variable<double> *instance)

{
  register_type *prVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,std::_Identity<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>,yyml::detail::PointerComp<yyml::nn::Variable<double>>,std::allocator<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>>
  *this;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  const_iterator __position;
  
  if (instance != (Variable<double> *)0x0) {
    prVar1 = registry();
    p_Var2 = (prVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var4 = &(prVar1->_M_t)._M_impl.super__Rb_tree_header._M_header;
    p_Var3 = p_Var4;
    if (p_Var2 != (_Base_ptr)0x0) {
      do {
        if (*(Variable<double> **)(p_Var2 + 1) >= instance) {
          p_Var3 = p_Var2;
        }
        p_Var2 = (&p_Var2->_M_left)[*(Variable<double> **)(p_Var2 + 1) < instance];
      } while (p_Var2 != (_Base_ptr)0x0);
      if ((p_Var3 != p_Var4) && (*(Variable<double> **)(p_Var3 + 1) <= instance)) {
        p_Var4 = p_Var3;
      }
    }
    prVar1 = registry();
    if ((_Rb_tree_header *)p_Var4 != &(prVar1->_M_t)._M_impl.super__Rb_tree_header) {
      prVar1 = registry();
      p_Var2 = (prVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var5 = &(prVar1->_M_t)._M_impl.super__Rb_tree_header;
      p_Var3 = &p_Var5->_M_header;
      __position._M_node = &p_Var5->_M_header;
      if (p_Var2 != (_Base_ptr)0x0) {
        do {
          if (*(Variable<double> **)(p_Var2 + 1) >= instance) {
            p_Var3 = p_Var2;
          }
          p_Var2 = (&p_Var2->_M_left)[*(Variable<double> **)(p_Var2 + 1) < instance];
        } while (p_Var2 != (_Base_ptr)0x0);
        __position._M_node = p_Var3;
        if (((_Rb_tree_header *)p_Var3 != p_Var5) &&
           (__position._M_node = &p_Var5->_M_header, *(Variable<double> **)(p_Var3 + 1) <= instance)
           ) {
          __position._M_node = p_Var3;
        }
      }
      this = (_Rb_tree<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,std::_Identity<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>,yyml::detail::PointerComp<yyml::nn::Variable<double>>,std::allocator<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>>
              *)registry();
      std::
      _Rb_tree<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,std::_Identity<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>,yyml::detail::PointerComp<yyml::nn::Variable<double>>,std::allocator<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>>
      ::erase_abi_cxx11_(this,__position);
      return;
    }
  }
  return;
}

Assistant:

static void RemoveInstance(Type *instance) {
    if (instance != nullptr && registry().find(instance) != registry().end()) {
      auto iter = registry().find(instance);
      registry().erase(iter);
    }
  }